

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O2

pthread_key_t
testing::internal::ThreadLocal<testing::TestPartResultReporterInterface_*>::CreateKey(void)

{
  int iVar1;
  ostream *poVar2;
  GTestLog local_10;
  pthread_key_t key;
  
  iVar1 = pthread_key_create(&key,DeleteThreadLocalValue);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_10,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/gtest/include/gtest/internal/gtest-port.h"
                       ,0x556);
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "pthread_key_create(&key, &DeleteThreadLocalValue)");
    poVar2 = std::operator<<(poVar2,"failed with error ");
    std::ostream::operator<<(poVar2,iVar1);
    GTestLog::~GTestLog(&local_10);
  }
  return key;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }